

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
ChainstateManager::AcceptBlockHeader
          (ChainstateManager *this,CBlockHeader *block,BlockValidationState *state,
          CBlockIndex **ppindex,bool min_pow_checked)

{
  _Rb_tree_header *p_Var1;
  uint256 *__k;
  long lVar2;
  CChainParams *consensusParams;
  ulong uVar3;
  CBlockIndex *pCVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  __node_base_ptr p_Var8;
  Logger *pLVar9;
  CBlockIndex *pCVar10;
  CBlockIndex *pCVar11;
  _Rb_tree_node_base *p_Var12;
  _Hash_node_base *p_Var13;
  int source_line;
  undefined7 in_register_00000081;
  CBlockIndex *args_1;
  BlockMap *this_00;
  LogFlags flag;
  Level level;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  CBlockIndex *local_a0;
  string local_98;
  string msg;
  uint256 hash;
  
  args_1 = (CBlockIndex *)CONCAT71(in_register_00000081,min_pow_checked);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash(&hash,block);
  this_00 = &(this->m_blockman).m_block_index;
  uVar3 = CONCAT17(hash.super_base_blob<256U>.m_data._M_elems[7],
                   CONCAT16(hash.super_base_blob<256U>.m_data._M_elems[6],
                            CONCAT15(hash.super_base_blob<256U>.m_data._M_elems[5],
                                     CONCAT14(hash.super_base_blob<256U>.m_data._M_elems[4],
                                              CONCAT13(hash.super_base_blob<256U>.m_data._M_elems[3]
                                                       ,CONCAT12(hash.super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(hash.super_base_blob<256U>
                                                                          .m_data._M_elems[1],
                                                                          hash.super_base_blob<256U>
                                                                          .m_data._M_elems[0])))))))
  ;
  p_Var13 = (_Hash_node_base *)0x0;
  p_Var8 = std::
           _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,uVar3 % (this->m_blockman).m_block_index._M_h._M_bucket_count,
                      &hash,uVar3);
  if (p_Var8 != (__node_base_ptr)0x0) {
    p_Var13 = p_Var8->_M_nxt;
  }
  consensusParams = (this->m_options).chainparams;
  auVar15[0] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0] == hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar15[1] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [1] == hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar15[2] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [2] == hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar15[3] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [3] == hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar15[4] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [4] == hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar15[5] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [5] == hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar15[6] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [6] == hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar15[7] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [7] == hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar15[8] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [8] == hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar15[9] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [9] == hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar15[10] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                  _M_elems[10] == hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar15[0xb] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xb] == hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar15[0xc] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xc] == hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar15[0xd] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xd] == hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar15[0xe] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xe] == hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar15[0xf] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xf] == hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar14[0] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x10] == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar14[1] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x11] == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar14[2] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x12] == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar14[3] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x13] == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar14[4] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x14] == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar14[5] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x15] == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar14[6] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x16] == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar14[7] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x17] == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar14[8] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x18] == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar14[9] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x19] == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar14[10] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                  _M_elems[0x1a] == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar14[0xb] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1b] == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar14[0xc] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1c] == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar14[0xd] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1d] == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar14[0xe] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1e] == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar14[0xf] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1f] == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar14 = auVar14 & auVar15;
  if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
LAB_004034bd:
    if (!min_pow_checked) {
      pLVar9 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
      if (bVar5) {
        base_blob<256u>::ToString_abi_cxx11_(&msg,&hash);
        logging_function_03._M_str = "AcceptBlockHeader";
        logging_function_03._M_len = 0x11;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x5e;
        LogPrintFormatInternal<char[18],std::__cxx11::string>
                  (logging_function_03,source_file_03,0x10fe,VALIDATION,Debug,
                   (ConstevalFormatString<2U>)0x822890,(char (*) [18])"AcceptBlockHeader",&msg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"too-little-chainwork","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      bVar6 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_HEADER_LOW_WORK,
                         &msg,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_004030e6:
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
LAB_004030f3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      goto LAB_004036de;
    }
    pCVar10 = ::node::BlockManager::AddToBlockIndex(&this->m_blockman,block,&this->m_best_header);
    if (ppindex != (CBlockIndex **)0x0) {
      *ppindex = pCVar10;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_98,&hash);
    tinyformat::format<std::__cxx11::string,int>
              (&msg,(tinyformat *)"Saw new header hash=%s height=%d",(char *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pCVar10->nHeight,(int *)args_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar5 = IsInitialBlockDownload(this);
    if (bVar5) {
      pLVar9 = LogInstance();
      flag = VALIDATION;
      level = Debug;
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
      source_line = 0x1112;
      if (bVar5) goto LAB_00403687;
    }
    else {
      level = Info;
      flag = ALL;
      source_line = 0x1114;
LAB_00403687:
      logging_function_04._M_str = "AcceptBlockHeader";
      logging_function_04._M_len = 0x11;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_04._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_04,source_file_04,source_line,flag,level,
                 (ConstevalFormatString<1U>)0x8815f5,&msg);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (p_Var13 == (_Hash_node_base *)0x0) {
      bVar5 = CheckBlockHeader(block,state,&consensusParams->consensus,true);
      if (!bVar5) {
        pLVar9 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
        if (bVar5) {
          base_blob<256u>::ToString_abi_cxx11_(&msg,&hash);
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    (&local_98,&state->super_ValidationState<BlockValidationResult>);
          logging_function_01._M_str = "AcceptBlockHeader";
          logging_function_01._M_len = 0x11;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_01._M_len = 0x5e;
          LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                    (logging_function_01,source_file_01,0x10c1,VALIDATION,Debug,
                     (ConstevalFormatString<3U>)0x822732,(char (*) [18])"AcceptBlockHeader",&msg,
                     &local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        bVar6 = 0;
        goto LAB_004036de;
      }
      __k = &block->hashPrevBlock;
      uVar3 = *(ulong *)(block->hashPrevBlock).super_base_blob<256U>.m_data._M_elems;
      p_Var13 = (_Hash_node_base *)0x0;
      args_1 = (CBlockIndex *)__k;
      p_Var8 = std::
               _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (&this_00->_M_h,
                          uVar3 % (this->m_blockman).m_block_index._M_h._M_bucket_count,__k,uVar3);
      if (p_Var8 != (__node_base_ptr)0x0) {
        p_Var13 = p_Var8->_M_nxt;
      }
      if (p_Var13 == (_Hash_node_base *)0x0) {
        pLVar9 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
        if (bVar5) {
          base_blob<256u>::ToString_abi_cxx11_(&msg,&hash);
          base_blob<256u>::ToString_abi_cxx11_(&local_98,__k);
          args_1 = (CBlockIndex *)0x10c9;
          logging_function_02._M_str = "AcceptBlockHeader";
          logging_function_02._M_len = 0x11;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_02._M_len = 0x5e;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_02,source_file_02,0x10c9,VALIDATION,Debug,
                     (ConstevalFormatString<2U>)0x82275b,&msg,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        msg._M_dataplus._M_p = (pointer)&msg.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"prev-blk-not-found","");
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        bVar5 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_MISSING_PREV,
                           &msg,&local_98);
LAB_00403479:
        this_00 = (BlockMap *)(ulong)bVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
      }
      else {
        if (((ulong)p_Var13[0x10]._M_nxt & 0x60) != 0) {
          pLVar9 = LogInstance();
          bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
          if (bVar5) {
            base_blob<256u>::ToString_abi_cxx11_(&msg,&hash);
            base_blob<256u>::ToString_abi_cxx11_(&local_98,__k);
            args_1 = (CBlockIndex *)0x10ce;
            logging_function_00._M_str = "AcceptBlockHeader";
            logging_function_00._M_len = 0x11;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_00._M_len = 0x5e;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_00,source_file_00,0x10ce,VALIDATION,Debug,
                       (ConstevalFormatString<2U>)0x822796,&msg,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          msg._M_dataplus._M_p = (pointer)&msg.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"bad-prevblk","");
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          bVar5 = ValidationState<BlockValidationResult>::Invalid
                            (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_PREV
                             ,&msg,&local_98);
          goto LAB_00403479;
        }
        pCVar10 = (CBlockIndex *)(p_Var13 + 5);
        args_1 = pCVar10;
        bVar5 = ContextualCheckBlockHeader(block,state,&this->m_blockman,this,pCVar10);
        if (bVar5) {
          if ((*(uint *)&p_Var13[0x10]._M_nxt & 0x60) == 0 &&
              4 < (*(uint *)&p_Var13[0x10]._M_nxt & 7)) {
            bVar5 = true;
          }
          else {
            p_Var12 = (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var1 = &(this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header;
            bVar5 = (_Rb_tree_header *)p_Var12 == p_Var1;
            if (!bVar5) {
              do {
                pCVar4 = *(CBlockIndex **)(p_Var12 + 1);
                pCVar11 = CBlockIndex::GetAncestor(pCVar10,pCVar4->nHeight);
                if (pCVar11 == pCVar4) {
                  if ((pCVar4->nStatus & 0x20) == 0) {
                    __assert_fail("failedit->nStatus & BLOCK_FAILED_VALID",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                  ,0x10f0,
                                  "bool ChainstateManager::AcceptBlockHeader(const CBlockHeader &, BlockValidationState &, CBlockIndex **, bool)"
                                 );
                  }
                  for (local_a0 = pCVar10; local_a0 != pCVar4; local_a0 = local_a0->pprev) {
                    *(byte *)&local_a0->nStatus = (byte)local_a0->nStatus | 0x40;
                    std::
                    _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    ::_M_insert_unique<CBlockIndex*const&>
                              ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                                *)&(this->m_blockman).m_dirty_blockindex,&local_a0);
                  }
                  pLVar9 = LogInstance();
                  bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
                  if (bVar7) {
                    base_blob<256u>::ToString_abi_cxx11_(&msg,&hash);
                    base_blob<256u>::ToString_abi_cxx11_(&local_98,__k);
                    args_1 = (CBlockIndex *)0x10f7;
                    logging_function_06._M_str = "AcceptBlockHeader";
                    logging_function_06._M_len = 0x11;
                    source_file_06._M_str =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ;
                    source_file_06._M_len = 0x5e;
                    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                              (logging_function_06,source_file_06,0x10f7,VALIDATION,Debug,
                               (ConstevalFormatString<2U>)0x822796,&msg,&local_98);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_98._M_dataplus._M_p != &local_98.field_2) {
                      operator_delete(local_98._M_dataplus._M_p,
                                      local_98.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg._M_dataplus._M_p != &msg.field_2) {
                      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                    }
                  }
                  msg._M_dataplus._M_p = (pointer)&msg.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"bad-prevblk","");
                  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
                  bVar7 = ValidationState<BlockValidationResult>::Invalid
                                    (&state->super_ValidationState<BlockValidationResult>,
                                     BLOCK_INVALID_PREV,&msg,&local_98);
                  this_00 = (BlockMap *)(ulong)bVar7;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    operator_delete(local_98._M_dataplus._M_p,
                                    local_98.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                  }
                }
                if (pCVar11 == pCVar4) break;
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
                bVar5 = (_Rb_tree_header *)p_Var12 == p_Var1;
              } while (!bVar5);
            }
          }
        }
        else {
          pLVar9 = LogInstance();
          bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
          if (bVar5) {
            base_blob<256u>::ToString_abi_cxx11_(&msg,&hash);
            ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                      (&local_98,&state->super_ValidationState<BlockValidationResult>);
            args_1 = (CBlockIndex *)0x10d2;
            logging_function_05._M_str = "AcceptBlockHeader";
            logging_function_05._M_len = 0x11;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_05._M_len = 0x5e;
            LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                      (logging_function_05,source_file_05,0x10d2,VALIDATION,Debug,
                       (ConstevalFormatString<3U>)0x8227c8,(char (*) [18])"AcceptBlockHeader",&msg,
                       &local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          bVar5 = false;
          this_00 = (BlockMap *)0x0;
        }
      }
      bVar6 = (byte)this_00;
      if (!bVar5) goto LAB_004036de;
      goto LAB_004034bd;
    }
    if (ppindex != (CBlockIndex **)0x0) {
      *ppindex = (CBlockIndex *)(p_Var13 + 5);
    }
    if (((ulong)p_Var13[0x10]._M_nxt & 0x60) != 0) {
      pLVar9 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,VALIDATION,Debug);
      if (bVar5) {
        base_blob<256u>::ToString_abi_cxx11_(&msg,&hash);
        logging_function._M_str = "AcceptBlockHeader";
        logging_function._M_len = 0x11;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        LogPrintFormatInternal<char[18],std::__cxx11::string>
                  (logging_function,source_file,0x10ba,VALIDATION,Debug,
                   (ConstevalFormatString<2U>)0x822712,(char (*) [18])"AcceptBlockHeader",&msg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"duplicate","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      bVar6 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CACHED_INVALID,
                         &msg,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_004030e6;
      goto LAB_004030f3;
    }
  }
  bVar6 = 1;
LAB_004036de:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::AcceptBlockHeader(const CBlockHeader& block, BlockValidationState& state, CBlockIndex** ppindex, bool min_pow_checked)
{
    AssertLockHeld(cs_main);

    // Check for duplicate
    uint256 hash = block.GetHash();
    BlockMap::iterator miSelf{m_blockman.m_block_index.find(hash)};
    if (hash != GetConsensus().hashGenesisBlock) {
        if (miSelf != m_blockman.m_block_index.end()) {
            // Block header is already known.
            CBlockIndex* pindex = &(miSelf->second);
            if (ppindex)
                *ppindex = pindex;
            if (pindex->nStatus & BLOCK_FAILED_MASK) {
                LogDebug(BCLog::VALIDATION, "%s: block %s is marked invalid\n", __func__, hash.ToString());
                return state.Invalid(BlockValidationResult::BLOCK_CACHED_INVALID, "duplicate");
            }
            return true;
        }

        if (!CheckBlockHeader(block, state, GetConsensus())) {
            LogDebug(BCLog::VALIDATION, "%s: Consensus::CheckBlockHeader: %s, %s\n", __func__, hash.ToString(), state.ToString());
            return false;
        }

        // Get prev block index
        CBlockIndex* pindexPrev = nullptr;
        BlockMap::iterator mi{m_blockman.m_block_index.find(block.hashPrevBlock)};
        if (mi == m_blockman.m_block_index.end()) {
            LogDebug(BCLog::VALIDATION, "header %s has prev block not found: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
            return state.Invalid(BlockValidationResult::BLOCK_MISSING_PREV, "prev-blk-not-found");
        }
        pindexPrev = &((*mi).second);
        if (pindexPrev->nStatus & BLOCK_FAILED_MASK) {
            LogDebug(BCLog::VALIDATION, "header %s has prev block invalid: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
            return state.Invalid(BlockValidationResult::BLOCK_INVALID_PREV, "bad-prevblk");
        }
        if (!ContextualCheckBlockHeader(block, state, m_blockman, *this, pindexPrev)) {
            LogDebug(BCLog::VALIDATION, "%s: Consensus::ContextualCheckBlockHeader: %s, %s\n", __func__, hash.ToString(), state.ToString());
            return false;
        }

        /* Determine if this block descends from any block which has been found
         * invalid (m_failed_blocks), then mark pindexPrev and any blocks between
         * them as failed. For example:
         *
         *                D3
         *              /
         *      B2 - C2
         *    /         \
         *  A             D2 - E2 - F2
         *    \
         *      B1 - C1 - D1 - E1
         *
         * In the case that we attempted to reorg from E1 to F2, only to find
         * C2 to be invalid, we would mark D2, E2, and F2 as BLOCK_FAILED_CHILD
         * but NOT D3 (it was not in any of our candidate sets at the time).
         *
         * In any case D3 will also be marked as BLOCK_FAILED_CHILD at restart
         * in LoadBlockIndex.
         */
        if (!pindexPrev->IsValid(BLOCK_VALID_SCRIPTS)) {
            // The above does not mean "invalid": it checks if the previous block
            // hasn't been validated up to BLOCK_VALID_SCRIPTS. This is a performance
            // optimization, in the common case of adding a new block to the tip,
            // we don't need to iterate over the failed blocks list.
            for (const CBlockIndex* failedit : m_failed_blocks) {
                if (pindexPrev->GetAncestor(failedit->nHeight) == failedit) {
                    assert(failedit->nStatus & BLOCK_FAILED_VALID);
                    CBlockIndex* invalid_walk = pindexPrev;
                    while (invalid_walk != failedit) {
                        invalid_walk->nStatus |= BLOCK_FAILED_CHILD;
                        m_blockman.m_dirty_blockindex.insert(invalid_walk);
                        invalid_walk = invalid_walk->pprev;
                    }
                    LogDebug(BCLog::VALIDATION, "header %s has prev block invalid: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
                    return state.Invalid(BlockValidationResult::BLOCK_INVALID_PREV, "bad-prevblk");
                }
            }
        }
    }
    if (!min_pow_checked) {
        LogDebug(BCLog::VALIDATION, "%s: not adding new block header %s, missing anti-dos proof-of-work validation\n", __func__, hash.ToString());
        return state.Invalid(BlockValidationResult::BLOCK_HEADER_LOW_WORK, "too-little-chainwork");
    }
    CBlockIndex* pindex{m_blockman.AddToBlockIndex(block, m_best_header)};

    if (ppindex)
        *ppindex = pindex;

    // Since this is the earliest point at which we have determined that a
    // header is both new and valid, log here.
    //
    // These messages are valuable for detecting potential selfish mining behavior;
    // if multiple displacing headers are seen near simultaneously across many
    // nodes in the network, this might be an indication of selfish mining. Having
    // this log by default when not in IBD ensures broad availability of this data
    // in case investigation is merited.
    const auto msg = strprintf(
        "Saw new header hash=%s height=%d", hash.ToString(), pindex->nHeight);

    if (IsInitialBlockDownload()) {
        LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Debug, "%s\n", msg);
    } else {
        LogPrintf("%s\n", msg);
    }

    return true;
}